

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_cache.c
# Opt level: O1

slab * slab_get_large(slab_cache *cache,size_t size)

{
  size_t __size;
  size_t *psVar1;
  small_stats *psVar2;
  uint8_t uVar3;
  quota *pqVar4;
  ulong uVar5;
  rlist *prVar6;
  uint uVar7;
  slab *psVar8;
  uint uVar9;
  char cVar10;
  bool bVar11;
  unsigned_long _zzq_args [6];
  unsigned_long _zzq_result;
  
  __size = size + 0x30;
  if (__size < 0x3fffffffc01) {
    if (__size == 0) {
      __assert_fail("size_in_units",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                    ,0x89,"ssize_t quota_use(struct quota *, size_t)");
    }
    pqVar4 = cache->arena->quota;
    do {
      uVar5 = pqVar4->value;
      uVar7 = (uint)(size + 0x42f >> 10);
      uVar9 = (uint)uVar5 + uVar7;
      if (uVar9 <= (uint)uVar5) {
        __assert_fail("new_used_in_units > used_in_units",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                      ,0x90,"ssize_t quota_use(struct quota *, size_t)");
      }
      cVar10 = '\x01';
      if (uVar9 <= (uint)(uVar5 >> 0x20)) {
        LOCK();
        bVar11 = uVar5 == pqVar4->value;
        if (bVar11) {
          pqVar4->value = (ulong)uVar9 | uVar5 & 0xffffffff00000000;
        }
        UNLOCK();
        cVar10 = bVar11 * '\x03';
      }
    } while (cVar10 == '\0');
    if (cVar10 == '\x03') {
      psVar8 = (slab *)malloc(__size);
      if (psVar8 != (slab *)0x0) {
        uVar3 = cache->order_max;
        psVar8->magic = 0xeec0ffee;
        psVar8->order = uVar3 + '\x01';
        psVar8->in_use = '\0';
        psVar8->size = __size;
        (psVar8->next_in_cache).prev = &(cache->allocated).slabs;
        prVar6 = (cache->allocated).slabs.next;
        (psVar8->next_in_cache).next = prVar6;
        (cache->allocated).slabs.next = (rlist *)psVar8;
        prVar6->prev = (rlist *)psVar8;
        psVar1 = &(cache->allocated).stats.total;
        *psVar1 = *psVar1 + __size;
        psVar2 = &(cache->allocated).stats;
        psVar2->used = psVar2->used + __size;
        return psVar8;
      }
      if (__size != 0x3fffffffc00) {
        pqVar4 = cache->arena->quota;
        do {
          uVar5 = pqVar4->value;
          if ((uint)uVar5 < uVar7) {
            __assert_fail("size_in_units <= used_in_units",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                          ,0xab,"ssize_t quota_release(struct quota *, size_t)");
          }
          LOCK();
          bVar11 = uVar5 == pqVar4->value;
          if (bVar11) {
            pqVar4->value = (ulong)((uint)uVar5 - uVar7) | uVar5 & 0xffffffff00000000;
          }
          UNLOCK();
        } while (!bVar11);
        return (slab *)0x0;
      }
      __assert_fail("size < QUOTA_MAX",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                    ,0xa2,"ssize_t quota_release(struct quota *, size_t)");
    }
  }
  return (slab *)0x0;
}

Assistant:

struct slab *
slab_get_large(struct slab_cache *cache, size_t size)
{
	size += slab_sizeof();
	if (quota_use(cache->arena->quota, size) < 0)
		return NULL;
	struct slab *slab = (struct slab *) malloc(size);
	if (slab == NULL) {
		quota_release(cache->arena->quota, size);
		return NULL;
	}

	slab_create(slab, cache->order_max + 1, size);
	slab_list_add(&cache->allocated, slab, next_in_cache);
	cache->allocated.stats.used += size;
	VALGRIND_MEMPOOL_ALLOC(cache, slab_data(slab),
			       slab_capacity(slab));
	return slab;
}